

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

bool __thiscall
duckdb_re2::BitState::Search
          (BitState *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  undefined8 *puVar1;
  bool bVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  char *p0;
  __uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter> local_40;
  
  sVar3 = text->size_;
  (this->text_).data_ = text->data_;
  (this->text_).size_ = sVar3;
  sVar3 = context->size_;
  (this->context_).data_ = context->data_;
  (this->context_).size_ = sVar3;
  if ((this->context_).data_ == (const_pointer)0x0) {
    sVar3 = text->size_;
    (this->context_).data_ = text->data_;
    (this->context_).size_ = sVar3;
  }
  bVar4 = this->prog_->anchor_start_;
  if (((bVar4 != true) || ((this->context_).data_ == text->data_)) &&
     ((bVar2 = this->prog_->anchor_end_, bVar2 != true ||
      ((this->context_).data_ + (this->context_).size_ == text->data_ + text->size_)))) {
    if (anchored) {
      bVar4 = true;
    }
    this->anchored_ = bVar4;
    bVar4 = bVar2;
    if (longest) {
      bVar4 = true;
    }
    this->longest_ = bVar4;
    this->endmatch_ = bVar2;
    this->submatch_ = submatch;
    this->nsubmatch_ = nsubmatch;
    lVar6 = 0;
    iVar5 = nsubmatch;
    for (lVar8 = 0; lVar8 < iVar5; lVar8 = lVar8 + 1) {
      puVar1 = (undefined8 *)((long)&this->submatch_->data_ + lVar6);
      *puVar1 = 0;
      puVar1[1] = 0;
      iVar5 = this->nsubmatch_;
      lVar6 = lVar6 + 0x10;
    }
    iVar5 = (((int)text->size_ + 1) * this->prog_->list_count_ + 0x3f) / 0x40;
    PODArray<unsigned_long>::PODArray((PODArray<unsigned_long> *)&local_40,iVar5);
    std::__uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter>::operator=
              ((__uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter> *)
               &this->visited_,
               (__uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter> *)
               &local_40);
    std::unique_ptr<unsigned_long[],_duckdb_re2::PODArray<unsigned_long>::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_long[],_duckdb_re2::PODArray<unsigned_long>::Deleter> *)
               &local_40);
    switchD_014c3389::default
              ((this->visited_).ptr_._M_t.
               super___uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter>.
               _M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_duckdb_re2::PODArray<unsigned_long>::Deleter>
               .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,0,(long)iVar5 << 3);
    uVar10 = 2;
    if (2 < nsubmatch * 2) {
      uVar10 = (ulong)(uint)(nsubmatch * 2);
    }
    PODArray<const_char_*>::PODArray((PODArray<const_char_*> *)&local_40,(int)uVar10);
    std::__uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>::operator=
              ((__uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter> *)
               &this->cap_,&local_40);
    std::unique_ptr<const_char_*[],_duckdb_re2::PODArray<const_char_*>::Deleter>::~unique_ptr
              ((unique_ptr<const_char_*[],_duckdb_re2::PODArray<const_char_*>::Deleter> *)&local_40)
    ;
    switchD_014c3389::default
              ((this->cap_).ptr_._M_t.
               super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>._M_t
               .super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl,0,uVar10 << 3);
    PODArray<duckdb_re2::Job>::PODArray((PODArray<duckdb_re2::Job> *)&local_40,0x40);
    std::__uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>::operator=
              ((__uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter> *)
               &this->job_,
               (__uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter> *)
               &local_40);
    std::unique_ptr<duckdb_re2::Job[],_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>::~unique_ptr
              ((unique_ptr<duckdb_re2::Job[],_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter> *)
               &local_40);
    pcVar7 = text->data_;
    if (this->anchored_ != false) {
      *(this->cap_).ptr_._M_t.
       super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>._M_t.
       super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>.
       super__Head_base<0UL,_const_char_**,_false>._M_head_impl = pcVar7;
      bVar4 = TrySearch(this,this->prog_->start_,pcVar7);
      return bVar4;
    }
    pcVar9 = pcVar7 + text->size_;
    do {
      if (pcVar9 < pcVar7) {
        return false;
      }
      p0 = pcVar7;
      if (((pcVar7 < pcVar9) && (this->prog_->prefix_size_ != 0)) &&
         (pcVar7 = (char *)Prog::PrefixAccel(this->prog_,pcVar7,(long)pcVar9 - (long)pcVar7),
         p0 = pcVar9, pcVar7 != (char *)0x0)) {
        p0 = pcVar7;
      }
      *(this->cap_).ptr_._M_t.
       super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>._M_t.
       super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>.
       super__Head_base<0UL,_const_char_**,_false>._M_head_impl = p0;
      bVar4 = TrySearch(this,this->prog_->start_,p0);
      if (bVar4) {
        return true;
      }
      pcVar7 = p0 + 1;
    } while (p0 != (char *)0x0);
  }
  return false;
}

Assistant:

bool BitState::Search(const StringPiece& text, const StringPiece& context,
                      bool anchored, bool longest,
                      StringPiece* submatch, int nsubmatch) {
  // Search parameters.
  text_ = text;
  context_ = context;
  if (context_.data() == NULL)
    context_ = text;
  if (prog_->anchor_start() && BeginPtr(context_) != BeginPtr(text))
    return false;
  if (prog_->anchor_end() && EndPtr(context_) != EndPtr(text))
    return false;
  anchored_ = anchored || prog_->anchor_start();
  longest_ = longest || prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  for (int i = 0; i < nsubmatch_; i++)
    submatch_[i] = StringPiece();

  // Allocate scratch space.
  int nvisited = prog_->list_count() * static_cast<int>(text.size()+1);
  nvisited = (nvisited + kVisitedBits-1) / kVisitedBits;
  visited_ = PODArray<uint64_t>(nvisited);
  memset(visited_.data(), 0, nvisited*sizeof visited_[0]);

  int ncap = 2*nsubmatch;
  if (ncap < 2)
    ncap = 2;
  cap_ = PODArray<const char*>(ncap);
  memset(cap_.data(), 0, ncap*sizeof cap_[0]);

  // When sizeof(Job) == 16, we start with a nice round 1KiB. :)
  job_ = PODArray<Job>(64);

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.data();
    return TrySearch(prog_->start(), text.data());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  // This looks like it's quadratic in the size of the text,
  // but we are not clearing visited_ between calls to TrySearch,
  // so no work is duplicated and it ends up still being linear.
  const char* etext = text.data() + text.size();
  for (const char* p = text.data(); p <= etext; p++) {
    // Try to use prefix accel (e.g. memchr) to skip ahead.
    if (p < etext && prog_->can_prefix_accel()) {
      p = reinterpret_cast<const char*>(prog_->PrefixAccel(p, etext - p));
      if (p == NULL)
        p = etext;
    }

    cap_[0] = p;
    if (TrySearch(prog_->start(), p))  // Match must be leftmost; done.
      return true;
    // Avoid invoking undefined behavior (arithmetic on a null pointer)
    // by simply not continuing the loop.
    if (p == NULL)
      break;
  }
  return false;
}